

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter-basic.c
# Opt level: O0

int next_concat(hd_context *ctx,hd_stream *stm,size_t max)

{
  void *pvVar1;
  byte *pbVar2;
  size_t sVar3;
  size_t n;
  concat_filter *state;
  size_t max_local;
  hd_stream *stm_local;
  hd_context *ctx_local;
  
  pvVar1 = stm->state;
  do {
    if (*(int *)((long)pvVar1 + 4) <= *(int *)((long)pvVar1 + 8)) {
LAB_00132502:
      stm->rp = stm->wp;
      return -1;
    }
    if (stm->wp ==
        *(uchar **)(*(long *)((long)pvVar1 + (long)*(int *)((long)pvVar1 + 8) * 8 + 0x18) + 0x20)) {
      *(uchar **)(*(long *)((long)pvVar1 + (long)*(int *)((long)pvVar1 + 8) * 8 + 0x18) + 0x18) =
           stm->wp;
    }
    sVar3 = hd_available(ctx,*(hd_stream **)
                              ((long)pvVar1 + (long)*(int *)((long)pvVar1 + 8) * 8 + 0x18),max);
    if (sVar3 != 0) {
      stm->rp = *(uchar **)
                 (*(long *)((long)pvVar1 + (long)*(int *)((long)pvVar1 + 8) * 8 + 0x18) + 0x18);
      stm->wp = *(uchar **)
                 (*(long *)((long)pvVar1 + (long)*(int *)((long)pvVar1 + 8) * 8 + 0x18) + 0x20);
      stm->pos = stm->pos + (int)sVar3;
      pbVar2 = stm->rp;
      stm->rp = pbVar2 + 1;
      return (uint)*pbVar2;
    }
    if (*(int *)(*(long *)((long)pvVar1 + (long)*(int *)((long)pvVar1 + 8) * 8 + 0x18) + 4) != 0) {
      stm->error = 1;
      goto LAB_00132502;
    }
    *(int *)((long)pvVar1 + 8) = *(int *)((long)pvVar1 + 8) + 1;
    hd_drop_stream(ctx,*(hd_stream **)
                        ((long)pvVar1 + (long)(*(int *)((long)pvVar1 + 8) + -1) * 8 + 0x18));
    if (*(int *)((long)pvVar1 + 0xc) != 0) {
      stm->rp = (uchar *)((long)pvVar1 + 0x11);
      stm->wp = stm->rp + 1;
      stm->pos = stm->pos + 1;
      return 0x20;
    }
  } while( true );
}

Assistant:

static int
next_concat(hd_context *ctx, hd_stream *stm, size_t max)
{
    struct concat_filter *state = (struct concat_filter *)stm->state;
    size_t n;

    while (state->current < state->count)
    {
        /* Read the next block of underlying data. */
        if (stm->wp == state->chain[state->current]->wp)
            state->chain[state->current]->rp = stm->wp;
        n = hd_available(ctx, state->chain[state->current], max);
        if (n)
        {
            stm->rp = state->chain[state->current]->rp;
            stm->wp = state->chain[state->current]->wp;
            stm->pos += (int64_t)n;
            return *stm->rp++;
        }
        else
        {
            if (state->chain[state->current]->error)
            {
                stm->error = 1;
                break;
            }
            state->current++;
            hd_drop_stream(ctx, state->chain[state->current-1]);
            if (state->pad)
            {
                stm->rp = (&state->ws_buf)+1;
                stm->wp = stm->rp + 1;
                stm->pos++;
                return 32;
            }
        }
    }

    stm->rp = stm->wp;

    return EOF;
}